

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockMetadata_TLSF::MergeBlock(VmaBlockMetadata_TLSF *this,Block *block,Block *prev)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Block *in_RDI;
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *unaff_retaddr;
  
  *in_RSI = *in_RDX;
  in_RSI[1] = in_RDX[1] + in_RSI[1];
  in_RSI[2] = in_RDX[2];
  if (in_RSI[2] != 0) {
    *(undefined8 **)(in_RSI[2] + 0x18) = in_RSI;
  }
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Free(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::MergeBlock(Block* block, Block* prev)
{
    VMA_ASSERT(block->prevPhysical == prev && "Cannot merge seperate physical regions!");
    VMA_ASSERT(!prev->IsFree() && "Cannot merge block that belongs to free list!");

    block->offset = prev->offset;
    block->size += prev->size;
    block->prevPhysical = prev->prevPhysical;
    if (block->prevPhysical)
        block->prevPhysical->nextPhysical = block;
    m_BlockAllocator.Free(prev);
}